

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O2

shared_ptr<gui::DialogBox> __thiscall
EditorInterface::debugWidgetCreation<gui::DialogBox>
          (EditorInterface *this,shared_ptr<gui::DialogBox> *widget)

{
  Editor *pEVar1;
  level_enum lVar2;
  String *pSVar3;
  iterator iVar4;
  __weak_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt;
  shared_ptr<gui::DialogBox> sVar6;
  __shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  string local_48;
  
  lVar2 = spdlog::get_level();
  _Var5._M_pi = extraout_RDX;
  if ((int)lVar2 < 2) {
    pSVar3 = ::gui::Widget::getName((Widget *)(*in_RDX + 0x20));
    sf::String::operator_cast_to_string(&local_48,pSVar3);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                    *)(widget + 1),&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (((iVar4._M_node !=
          (_Base_ptr)
          &widget[1].super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount) &&
        (iVar4._M_node[2]._M_parent != (_Base_ptr)0x0)) &&
       (*(int *)&(iVar4._M_node[2]._M_parent)->_M_parent != 0)) {
      fmt.str.size_ = (size_t)(iVar4._M_node + 1);
      fmt.str.data_ = (char *)0x33;
      spdlog::warn<std::__cxx11::string_const&>
                ((spdlog *)"Created widget with name \"{}\" which already exists.",fmt,in_RCX);
    }
    std::dynamic_pointer_cast<gui::Widget,gui::DialogBox>((shared_ptr<gui::DialogBox> *)&_Stack_58);
    pSVar3 = ::gui::Widget::getName((Widget *)(*in_RDX + 0x20));
    sf::String::operator_cast_to_string(&local_48,pSVar3);
    this_00 = (__weak_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                            *)(widget + 1),&local_48);
    std::__weak_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&_Stack_58);
    std::__cxx11::string::~string((string *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
    _Var5._M_pi = extraout_RDX_00;
  }
  pEVar1 = (Editor *)in_RDX[1];
  in_RDX[1] = 0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)*in_RDX;
  this->editor_ = pEVar1;
  *in_RDX = 0;
  sVar6.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<gui::DialogBox>)
         sVar6.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> EditorInterface::debugWidgetCreation(std::shared_ptr<T> widget) const {
    if (spdlog::get_level() > spdlog::level::debug) {    // FIXME: probably not ideal to check this way. check the cmake build type instead? if so, then set spdlog::level with that too.
        return widget;
    }

    const auto foundWidget = debugWidgets_.find(widget->getName());
    if (foundWidget != debugWidgets_.end() && !foundWidget->second.expired()) {
        spdlog::warn("Created widget with name \"{}\" which already exists.", foundWidget->first);
    }

    debugWidgets_[widget->getName()] = std::dynamic_pointer_cast<gui::Widget>(widget);
    return widget;
}